

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>::on_num
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_long>
           *this)

{
  char cVar1;
  basic_format_specs<char> *specs;
  size_t sVar2;
  long lVar3;
  size_t __n;
  char cVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  ulong uVar11;
  char *it;
  int iVar12;
  int iVar13;
  int iVar14;
  int num_digits;
  ptrdiff_t _Num;
  ulong uVar15;
  ulong uVar16;
  string_view prefix;
  buffer<char> *c;
  string groups;
  write_int_data<char> data;
  undefined7 in_stack_ffffffffffffff48;
  buffer<char> *file;
  string local_a0;
  write_int_data<char> local_80;
  char *local_70;
  ulong local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  ulong local_50;
  int local_48;
  string *local_40;
  char local_38;
  
  grouping_impl<char>(&local_a0,(locale_ref)(this->locale).locale_);
  if (local_a0._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar4 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
    if (cVar4 == '\0') {
      on_dec(this);
    }
    else {
      uVar16 = this->abs_value;
      lVar3 = 0x3f;
      if ((uVar16 | 1) != 0) {
        for (; (uVar16 | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar5 = ((uint)lVar3 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
      iVar6 = (uVar5 + 1) -
              (uint)(uVar16 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                        (ulong)uVar5 * 8));
      pcVar8 = local_a0._M_dataplus._M_p + local_a0._M_string_length;
      _Var10._M_p = local_a0._M_dataplus._M_p;
      iVar13 = iVar6;
      num_digits = iVar6;
      if (local_a0._M_string_length != 0) {
        iVar12 = iVar6 + (int)local_a0._M_string_length;
        _Var9._M_p = local_a0._M_dataplus._M_p;
        do {
          cVar1 = *_Var9._M_p;
          iVar14 = iVar13 - cVar1;
          _Var10._M_p = _Var9._M_p;
          num_digits = iVar6;
          if ((iVar14 == 0 || iVar13 < cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) break;
          iVar6 = iVar6 + 1;
          _Var9._M_p = _Var9._M_p + 1;
          local_a0._M_string_length = local_a0._M_string_length - 1;
          _Var10._M_p = pcVar8;
          iVar13 = iVar14;
          num_digits = iVar12;
        } while (local_a0._M_string_length != 0);
      }
      if (_Var10._M_p == pcVar8) {
        num_digits = num_digits + (iVar13 + -1) / (int)pcVar8[-1];
      }
      file = (this->out).container;
      specs = this->specs;
      pcVar8 = this->prefix;
      uVar15 = (ulong)this->prefix_size;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = pcVar8;
      prefix.size_._4_4_ = 0;
      write_int_data<char>::write_int_data(&local_80,num_digits,prefix,specs);
      uVar11 = CONCAT44(local_80.size._4_4_,(undefined4)local_80.size);
      local_60 = (undefined4)local_80.size;
      uStack_5c = local_80.size._4_4_;
      uStack_58 = (undefined4)local_80.padding;
      uStack_54 = local_80.padding._4_4_;
      local_40 = &local_a0;
      uVar7 = (ulong)specs->width;
      local_70 = pcVar8;
      local_68 = uVar15;
      local_50 = uVar16;
      local_48 = num_digits;
      local_38 = cVar4;
      if ((long)uVar7 < 0) {
        assert_fail((char *)file,0,(char *)CONCAT17(cVar4,in_stack_ffffffffffffff48));
      }
      uVar16 = 0;
      if (uVar11 <= uVar7) {
        uVar16 = uVar7 - uVar11;
      }
      uVar7 = uVar16 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                  (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      sVar2 = file->size_;
      uVar11 = uVar11 + sVar2 + (specs->fill).size_ * uVar16;
      if (file->capacity_ < uVar11) {
        (**file->_vptr_buffer)(file,uVar11);
      }
      file->size_ = uVar11;
      pcVar8 = fill<char*,char>(file->ptr_ + sVar2,uVar7,&specs->fill);
      uVar11 = local_68;
      if (local_68 != 0) {
        memmove(pcVar8,local_70,local_68);
        pcVar8 = pcVar8 + uVar11;
      }
      __n = CONCAT44(uStack_54,uStack_58);
      it = pcVar8;
      if (__n != 0) {
        it = pcVar8 + __n;
        memset(pcVar8,0x30,__n);
      }
      pcVar8 = int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned_long>
               ::num_writer::operator()((num_writer *)&local_50,it);
      fill<char*,char>(pcVar8,uVar16 - uVar7,&specs->fill);
      (this->out).container = file;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && num_digits > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      num_digits -= *group;
      ++group;
    }
    if (group == groups.cend())
      size += sep_size * ((num_digits - 1) / groups.back());
    out = write_int(out, size, get_prefix(), specs,
                    num_writer{abs_value, size, groups, sep});
  }